

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

simple_token * tokenize_text(char *source,size_t start,size_t len,int format)

{
  int iVar1;
  simple_token *chain_start;
  simple_token *psVar2;
  char *pcVar3;
  char *stop;
  Scanner s;
  Scanner local_50;
  
  pcVar3 = source + start;
  local_50.start = pcVar3;
  local_50.cur = pcVar3;
  chain_start = simple_token_new(0,start,len);
  if (1 < (uint)format) {
    fprintf(_stderr,"ERROR.  %d is not a valid parsing format.\n",(ulong)(uint)format);
    return (simple_token *)0x0;
  }
  stop = pcVar3 + len;
  psVar2 = (simple_token *)0x0;
  do {
    if (format == 0) {
      iVar1 = scan_csv(&local_50,stop);
    }
    else {
      iVar1 = scan_tsv(&local_50,stop);
    }
    if ((long)local_50.start - (long)pcVar3 == 0) {
      if (iVar1 == 0 && pcVar3 < stop) goto LAB_001095f4;
      if (iVar1 == 0) goto LAB_00109618;
    }
    else {
      if (iVar1 == 0) {
        if (pcVar3 < stop) {
LAB_001095f4:
          psVar2 = simple_token_new(1,(long)pcVar3 - (long)source,(long)stop - (long)pcVar3);
          simple_token_chain_append(chain_start,psVar2);
        }
LAB_00109618:
        if (psVar2 == (simple_token *)0x0) {
          return chain_start;
        }
        if (psVar2->tail == (simple_token *)0x0) {
          return chain_start;
        }
        if (psVar2->tail->type == 4) {
          return chain_start;
        }
        psVar2 = simple_token_new(4,(long)local_50.start - (long)source,
                                  (long)local_50.cur - (long)local_50.start);
        simple_token_chain_append(chain_start,psVar2);
        return chain_start;
      }
      psVar2 = simple_token_new(1,(long)pcVar3 - (long)source,(long)local_50.start - (long)pcVar3);
      simple_token_chain_append(chain_start,psVar2);
      pcVar3 = local_50.start;
    }
    psVar2 = simple_token_new((unsigned_short)iVar1,(long)pcVar3 - (long)source,
                              (long)local_50.cur - (long)pcVar3);
    simple_token_chain_append(chain_start,psVar2);
    pcVar3 = local_50.cur;
  } while( true );
}

Assistant:

simple_token * tokenize_text(const char * source, size_t start, size_t len, int format) {

	// Create re2c scanner
	Scanner s;
	s.start = &source[start];		// Start parsing
	s.cur = s.start;

	int type;						// TOKEN type
	simple_token * t = NULL;		// Create token chain
	simple_token * root = simple_token_new(0, start, len);

	// Where do we stop parsing?
	const char * stop = s.start + len;

	// Remember last token to catch other text
	const char * last_stop = s.start;


	do {
		switch (format) {
			case FORMAT_CSV:
				type = scan_csv(&s, stop);
				break;

			case FORMAT_TSV:
				type = scan_tsv(&s, stop);
				break;

			default:
				// Error
				fprintf(stderr, "ERROR.  %d is not a valid parsing format.\n", format);
				return NULL;
				break;
		}

		if (s.start != last_stop) {
			// We skipped characters between tokens

			if (type) {
				t = simple_token_new(TEXT_PLAIN, (size_t)(last_stop - source), (size_t)(s.start - last_stop));
				simple_token_chain_append(root, t);
			} else {
				if (stop > last_stop) {
					// Source text ended without final token

					t = simple_token_new(TEXT_PLAIN, (size_t)(last_stop - source), (size_t)(stop - last_stop));
					simple_token_chain_append(root, t);
				}
			}
		} else if (type == 0 && stop > last_stop) {
			// Source text ended without final token

			t = simple_token_new(TEXT_PLAIN, (size_t)(last_stop - source), (size_t)(stop - last_stop));
			simple_token_chain_append(root, t);
		}

		switch (type) {
			case 0:

				// Source finished
				if (t && t->tail && (t->tail->type != TDP_EOF)) {
					t = simple_token_new(TDP_EOF, (size_t)(s.start - source), (size_t)(s.cur - s.start));
					simple_token_chain_append(root, t);
				}

				break;

			default:
				t = simple_token_new(type, (size_t)(s.start - source), (size_t)(s.cur - s.start));
				simple_token_chain_append(root, t);
				break;
		}

		// Remember where token ends to detect skipped characters
		last_stop = s.cur;
	} while (type != 0);

	return root;
}